

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O0

int X509_check_purpose(X509 *x,int id,int ca)

{
  int iVar1;
  X509_PURPOSE *pXVar2;
  X509_PURPOSE *pt;
  int ca_local;
  int id_local;
  X509 *x_local;
  
  iVar1 = x509v3_cache_extensions((X509 *)x);
  if (iVar1 == 0) {
    x_local._4_4_ = 0;
  }
  else if (id == -1) {
    x_local._4_4_ = 1;
  }
  else {
    pXVar2 = X509_PURPOSE_get0(id);
    if (pXVar2 == (X509_PURPOSE *)0x0) {
      x_local._4_4_ = 0;
    }
    else {
      if (((ca != 0) && (id != 7)) && (iVar1 = check_ca((X509 *)x), iVar1 == 0)) {
        return 0;
      }
      x_local._4_4_ = (**(code **)&pXVar2->flags)(pXVar2,x,ca);
    }
  }
  return x_local._4_4_;
}

Assistant:

int X509_check_purpose(X509 *x, int id, int ca) {
  // This differs from OpenSSL, which uses -1 to indicate a fatal error and 0 to
  // indicate an invalid certificate. BoringSSL uses 0 for both.
  if (!x509v3_cache_extensions(x)) {
    return 0;
  }

  if (id == -1) {
    return 1;
  }
  const X509_PURPOSE *pt = X509_PURPOSE_get0(id);
  if (pt == NULL) {
    return 0;
  }
  // Historically, |check_purpose| implementations other than |X509_PURPOSE_ANY|
  // called |check_ca|. This is redundant with the |X509_V_ERR_INVALID_CA|
  // logic, but |X509_check_purpose| is public API, so we preserve this
  // behavior.
  if (ca && id != X509_PURPOSE_ANY && !check_ca(x)) {
    return 0;
  }
  return pt->check_purpose(pt, x, ca);
}